

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

void objsetign(mcmcxdef *mctx,objnum objn)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  short *psVar5;
  int iVar6;
  uint uVar7;
  short *psVar8;
  bool bVar9;
  
  puVar4 = mcmlck(mctx,objn);
  uVar2 = *(ushort *)(puVar4 + 4);
  uVar3 = *(ushort *)(puVar4 + 2);
  psVar5 = (short *)(puVar4 + *(ushort *)(puVar4 + 0xc));
  iVar6 = (uint)*(ushort *)(puVar4 + 6) - (uint)*(ushort *)(puVar4 + 10);
  do {
    bVar9 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar9) {
      puVar1 = (ushort *)
               ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg
               + (ulong)((mctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
      *puVar1 = *puVar1 | 1;
      mcmunlck(mctx,objn);
      if ((uVar3 & 2) == 0) {
        return;
      }
      objindx(mctx,objn);
      return;
    }
    uVar7 = (uint)*(ushort *)(puVar4 + 10);
    psVar8 = (short *)(puVar4 + (ulong)uVar2 * 2 + 0xe);
    while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
      if (*psVar8 == *psVar5) {
        *(byte *)((long)psVar8 + 5) = *(byte *)((long)psVar8 + 5) | 2;
        break;
      }
      psVar8 = (short *)((long)psVar8 + (ulong)*(ushort *)((long)psVar8 + 3) + 6);
    }
    psVar5 = (short *)((long)psVar5 + (ulong)*(ushort *)((long)psVar5 + 3) + 6);
  } while( true );
}

Assistant:

void objsetign(mcmcxdef *mctx, objnum objn)
{
    objdef *objptr;
    prpdef *mut;
    prpdef *p;
    int     statcnt;
    int     cnt;
    int     indexed;
    prpdef *p1;
    
    objptr = (objdef *)mcmlck(mctx, (mcmon)objn);
    p1 = objprp(objptr);
    indexed = objflg(objptr) & OBJFINDEX;

    /* go through mutables, and set ignore on duplicates in non-mutables */
    for (mut = (prpdef *)(objptr + objrst(objptr)),
         cnt = objnprop(objptr) - objstat(objptr) ; cnt ;
         mut = objpnxt(mut), --cnt)
    {
        for (p = p1, statcnt = objstat(objptr) ; statcnt ;
             p = objpnxt(p), --statcnt)
        {
            /* if this static prop matches a mutable prop, ignore it */
            if (prpprop(p) == prpprop(mut))
            {
                prpflg(p) |= PRPFIGN;
                break;
            }
        }
    }
    
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
    if (indexed) objindx(mctx, objn);
}